

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O2

void Rwr_CutCountNumNodes_rec(Abc_Obj_t *pObj,Cut_Cut_t *pCut,Vec_Ptr_t *vNodes)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  
  do {
    uVar3 = 0;
    while (*(uint *)pCut >> 0x1c != uVar3) {
      lVar1 = uVar3 * 4;
      uVar3 = uVar3 + 1;
      if (*(int *)(&pCut[1].field_0x0 + lVar1) == pObj->Id) {
        if ((*(uint *)&pObj->field_0x14 & 0x40) == 0) {
          *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
          Vec_PtrPush(vNodes,pObj);
          return;
        }
        return;
      }
    }
    uVar2 = *(uint *)&pObj->field_0x14;
    if ((uVar2 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrEva.c"
                    ,0x1aa,"void Rwr_CutCountNumNodes_rec(Abc_Obj_t *, Cut_Cut_t *, Vec_Ptr_t *)");
    }
    if ((uVar2 & 0x40) == 0) {
      *(uint *)&pObj->field_0x14 = uVar2 | 0x40;
      Vec_PtrPush(vNodes,pObj);
    }
    Rwr_CutCountNumNodes_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],pCut,vNodes);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
  } while( true );
}

Assistant:

void Rwr_CutCountNumNodes_rec( Abc_Obj_t * pObj, Cut_Cut_t * pCut, Vec_Ptr_t * vNodes )
{
    int i;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] == pObj->Id )
        {
            // check if the node is collected
            if ( pObj->fMarkC == 0 )
            {
                pObj->fMarkC = 1;
                Vec_PtrPush( vNodes, pObj );
            }
            return;
        }
    assert( Abc_ObjIsNode(pObj) );
    // check if the node is collected
    if ( pObj->fMarkC == 0 )
    {
        pObj->fMarkC = 1;
        Vec_PtrPush( vNodes, pObj );
    }
    // traverse the fanins
    Rwr_CutCountNumNodes_rec( Abc_ObjFanin0(pObj), pCut, vNodes );
    Rwr_CutCountNumNodes_rec( Abc_ObjFanin1(pObj), pCut, vNodes );
}